

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

helper * __thiscall adios2::helper::CommDupMPI(helper *this,MPI_Comm mpiComm)

{
  MPI_Comm newComm;
  MPI_Comm local_10;
  
  if (mpiComm == (MPI_Comm)&ompi_mpi_comm_null) {
    local_10 = (MPI_Comm)&ompi_mpi_comm_null;
  }
  else {
    MPI_Comm_dup(mpiComm,&local_10);
  }
  CommWithMPI(this,local_10);
  return this;
}

Assistant:

Comm CommDupMPI(MPI_Comm mpiComm)
{
    MPI_Comm newComm;
    if (mpiComm != MPI_COMM_NULL)
    {
        MPI_Comm_dup(mpiComm, &newComm);
    }
    else
    {
        newComm = MPI_COMM_NULL;
    }
    return CommWithMPI(newComm);
}